

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          String *params_1,FixedArray<char,_1UL> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  String *pSVar3;
  FixedArray<char,_1UL> *pFVar4;
  char *pos;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_3;
  ArrayPtr<const_char> *rest_4;
  ArrayPtr<const_char> *rest_5;
  ArrayPtr<const_char> *rest_6;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_180;
  size_t local_178;
  size_t local_170;
  size_t local_168;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  _ *local_140;
  undefined8 local_138;
  Array<kj::StringTree::Branch> local_130;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  _ *local_c8;
  undefined8 local_c0;
  String local_b8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  _ *local_60;
  undefined8 local_58;
  undefined1 local_49;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  FixedArray<char,_1UL> *params_local_2;
  String *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_49 = 0;
  local_48 = params_3;
  params_local_4 = (ArrayPtr<const_char> *)params_2;
  params_local_3 = (ArrayPtr<const_char> *)params_1;
  params_local_2 = (FixedArray<char,_1UL> *)params;
  params_local_1 = (String *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_a0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_1);
  local_98 = String::size((String *)params_local_2);
  local_90 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_local_3);
  local_88 = ArrayPtr<const_char>::size(params_local_4);
  local_80 = ArrayPtr<const_char>::size(local_48);
  local_78 = ArrayPtr<const_char>::size(params_4);
  local_70 = ArrayPtr<const_char>::size(params_5);
  local_68 = ArrayPtr<const_char>::size(params_6);
  local_60 = (_ *)&local_a0;
  local_58 = 8;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x8;
  sVar1 = _::sum(local_60,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  local_108 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::String>((NoInfer<kj::String> *)params_local_2);
  local_100 = flatSize(pSVar3);
  pFVar4 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_3);
  local_f8 = flatSize<kj::FixedArray<char,1ul>>(pFVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_f0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(local_48);
  local_e8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_d8 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_d0 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  local_c8 = (_ *)&local_108;
  local_c0 = 8;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x8;
  sVar1 = _::sum(local_c8,nums_00);
  heapString(&local_b8,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_b8);
  String::~String(&local_b8);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  local_180 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::String>((NoInfer<kj::String> *)params_local_2);
  local_178 = branchCount(pSVar3);
  pFVar4 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_3);
  local_170 = branchCount<kj::FixedArray<char,1ul>>(pFVar4);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_168 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(local_48);
  local_160 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_158 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_150 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_148 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  local_140 = (_ *)&local_180;
  local_138 = 8;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x8;
  sVar1 = _::sum(local_140,nums_01);
  heapArray<kj::StringTree::Branch>(&local_130,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_130);
  Array<kj::StringTree::Branch>::~Array(&local_130);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  pSVar3 = fwd<kj::String>((NoInfer<kj::String> *)params_local_2);
  pFVar4 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>(local_48);
  rest_4 = fwd<kj::ArrayPtr<char_const>>(params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>(params_5);
  rest_6 = fwd<kj::ArrayPtr<char_const>>(params_6);
  fill<kj::ArrayPtr<char_const>,kj::String,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pAVar2,pSVar3,pFVar4,rest_2,rest_3,rest_4,rest_5,rest_6);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}